

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

QString * __thiscall QIODevice::errorString(QIODevice *this)

{
  QLatin1StringView latin1;
  bool bVar1;
  QIODevicePrivate *this_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  QIODevicePrivate *d;
  QString *in_stack_ffffffffffffffb8;
  QString *s;
  char *in_stack_fffffffffffffff0;
  qsizetype qVar2;
  
  qVar2 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  this_00 = d_func((QIODevice *)0x13bc37);
  bVar1 = QString::isEmpty((QString *)0x13bc4d);
  if (bVar1) {
    QLatin1StringView::QLatin1StringView((QLatin1StringView *)this_00,(char *)s);
    latin1.m_size = qVar2;
    latin1.m_data = in_stack_fffffffffffffff0;
    QString::QString((QString *)this_00,latin1);
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar2) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QString QIODevice::errorString() const
{
    Q_D(const QIODevice);
    if (d->errorString.isEmpty()) {
#ifdef QT_NO_QOBJECT
        return QLatin1StringView(QT_TRANSLATE_NOOP(QIODevice, "Unknown error"));
#else
        return tr("Unknown error");
#endif
    }
    return d->errorString;
}